

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

int64_t __thiscall mkvmuxer::Cluster::GetRelativeTimecode(Cluster *this,int64_t abs_timecode)

{
  uint64_t uVar1;
  int64_t rel_timecode;
  int64_t cluster_timecode;
  int64_t abs_timecode_local;
  Cluster *this_local;
  
  uVar1 = timecode(this);
  this_local = (Cluster *)(abs_timecode - uVar1);
  if (((long)this_local < 0) || (0x7fff < (long)this_local)) {
    this_local = (Cluster *)0xffffffffffffffff;
  }
  return (int64_t)this_local;
}

Assistant:

int64_t Cluster::GetRelativeTimecode(int64_t abs_timecode) const {
  const int64_t cluster_timecode = this->Cluster::timecode();
  const int64_t rel_timecode =
      static_cast<int64_t>(abs_timecode) - cluster_timecode;

  if (rel_timecode < 0 || rel_timecode > kMaxBlockTimecode)
    return -1;

  return rel_timecode;
}